

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repetition.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     cmps<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)0,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
               (Instruction<false> *instruction,unsigned_short *eCX,unsigned_short *eSI,
               unsigned_short *eDI,Context *context)

{
  bool bVar1;
  Source segment;
  type_conflict3 destination;
  type_conflict3 source;
  unsigned_short uVar2;
  unsigned_short rhs;
  unsigned_short lhs;
  Context *context_local;
  unsigned_short *eDI_local;
  unsigned_short *eSI_local;
  unsigned_short *eCX_local;
  Instruction<false> *instruction_local;
  
  bVar1 = repetition_over<unsigned_short,(InstructionSet::x86::Repetition)0>(eCX);
  if (!bVar1) {
    segment = Instruction<false>::data_segment(instruction);
    destination = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)0>
                            (&context->memory,segment,*eSI);
    source = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)0>
                       (&context->memory,ES,*eDI);
    uVar2 = Flags::direction<unsigned_short>(&context->flags);
    *eSI = *eSI + uVar2 * 2;
    uVar2 = Flags::direction<unsigned_short>(&context->flags);
    *eDI = *eDI + uVar2 * 2;
    sub<false,(InstructionSet::x86::AccessType)0,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
              (destination,source,context);
    repeat<unsigned_short,(InstructionSet::x86::Repetition)0,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
              (eCX,context);
  }
  return;
}

Assistant:

void cmps(
	const InstructionT &instruction,
	AddressT &eCX,
	AddressT &eSI,
	AddressT &eDI,
	ContextT &context
) {
	if(repetition_over<AddressT, repetition>(eCX)) {
		return;
	}

	IntT lhs = context.memory.template access<IntT, AccessType::Read>(instruction.data_segment(), eSI);
	const IntT rhs = context.memory.template access<IntT, AccessType::Read>(Source::ES, eDI);
	eSI += context.flags.template direction<AddressT>() * sizeof(IntT);
	eDI += context.flags.template direction<AddressT>() * sizeof(IntT);

	Primitive::sub<false, AccessType::Read, IntT>(lhs, rhs, context);

	repeat<AddressT, repetition>(eCX, context);
}